

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worn.c
# Opt level: O2

void m_dowear_type(level *lev,monst *mon,long flag,boolean creation,boolean racialexception)

{
  uint uVar1;
  obj *poVar2;
  boolean bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  obj *obj;
  char *pcVar9;
  byte bVar10;
  uchar uVar11;
  uint uVar12;
  obj *obj_00;
  obj *poVar13;
  uint uVar14;
  bool bVar15;
  char buf [256];
  char nambuf [256];
  
  uVar12 = 1;
  if (mon->wormno == '\0') {
    if ((viz_array[mon->my][mon->mx] & 2U) == 0) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0027705a;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00277051;
      }
      else {
LAB_00277051:
        if (ublindf == (obj *)0x0) goto LAB_0027710b;
LAB_0027705a:
        if (ublindf->oartifact != '\x1d') goto LAB_0027710b;
      }
      if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
           (((youmonst.data)->mflags3 & 0x100) == 0)) || ((viz_array[mon->my][mon->mx] & 1U) == 0))
         || ((mon->data->mflags3 & 0x200) == 0)) goto LAB_0027710b;
    }
  }
  else {
    bVar3 = worm_known(lev,mon);
    if (bVar3 == '\0') goto LAB_0027710b;
  }
  uVar14 = *(uint *)&mon->field_0x60;
  if ((((uVar14 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
    if ((char)uVar14 < '\0') goto LAB_0027710b;
  }
  else if (((char)uVar14 < '\0') || (((youmonst.data)->mflags1 & 0x1000000) == 0))
  goto LAB_0027710b;
  uVar12 = 1;
  if ((uVar14 >> 9 & 1) == 0) {
    uVar12 = (uint)u._1052_4_ >> 5 & 1;
  }
LAB_0027710b:
  if (mon->mfrozen == '\0') {
    if ((u.uprops[0xc].extrinsic == 0 && u.uprops[0xc].intrinsic == 0) &&
       (((youmonst.data)->mflags1 & 0x1000000) == 0)) {
      pcVar8 = mon_nam(mon);
    }
    else {
      pcVar8 = Monnam(mon);
    }
    strcpy(nambuf,pcVar8);
    obj = which_armor(mon,flag);
    if ((obj == (obj *)0x0) || ((flag != 0x10000 && ((*(uint *)&obj->field_0x4a & 1) == 0)))) {
      obj_00 = (obj *)&mon->minvent;
      poVar2 = obj;
LAB_002771cd:
      poVar13 = poVar2;
      obj_00 = obj_00->nobj;
      if (obj_00 == (obj *)0x0) goto LAB_0027744a;
      poVar2 = poVar13;
      switch(flag) {
      case 1:
        if (((obj_00->oclass != '\x03') || (objects[obj_00->otyp].oc_subtyp != '\0')) ||
           ((racialexception != '\0' && (iVar4 = racial_exception(mon,obj_00), iVar4 == 0))))
        goto LAB_002771cd;
        break;
      case 2:
        if (obj_00->oclass == '\x03') {
          bVar15 = objects[obj_00->otyp].oc_subtyp == '\x05';
          goto LAB_002773b8;
        }
        goto LAB_002771cd;
      case 3:
      case 5:
      case 6:
      case 7:
        break;
      case 4:
        if (((obj_00->oclass != '\x03') || (objects[obj_00->otyp].oc_subtyp != '\x02')) ||
           ((iVar4 = num_horns(mon->data), 0 < iVar4 &&
            (((long)obj_00->otyp != 0x3d &&
             ((*(ushort *)&objects[obj_00->otyp].field_0x11 & 0x180) != 0)))))) goto LAB_002771cd;
        break;
      case 8:
        if (obj_00->oclass != '\x03') goto LAB_002771cd;
        bVar15 = objects[obj_00->otyp].oc_subtyp == '\x01';
LAB_002773b8:
        if (!bVar15) goto LAB_002771cd;
        break;
      default:
        if (flag == 0x10) {
          if (obj_00->oclass == '\x03') {
            bVar15 = objects[obj_00->otyp].oc_subtyp == '\x03';
            goto LAB_002773b8;
          }
        }
        else if (flag == 0x20) {
          if (obj_00->oclass == '\x03') {
            bVar15 = objects[obj_00->otyp].oc_subtyp == '\x04';
            goto LAB_002773b8;
          }
        }
        else if (flag == 0x40) {
          if (obj_00->oclass == '\x03') {
            bVar15 = objects[obj_00->otyp].oc_subtyp == '\x06';
            goto LAB_002773b8;
          }
        }
        else {
          if (flag != 0x10000) break;
          if ((obj_00->oclass == '\x05') &&
             (((poVar13 = obj_00, obj_00->otyp == 0xca || (obj_00->otyp == 0xd0)) ||
              ((obj_00->oprops & 0x10) != 0)))) goto LAB_0027744a;
        }
        goto LAB_002771cd;
      }
      if ((obj_00->owornmask == 0) && (poVar2 = obj_00, poVar13 != (obj *)0x0)) {
        iVar4 = arm_bonus(poVar13,mon);
        iVar5 = extra_pref(mon,poVar13);
        iVar6 = arm_bonus(obj_00,mon);
        iVar7 = extra_pref(mon,obj_00);
        poVar2 = poVar13;
        if (iVar5 + iVar4 < iVar7 + iVar6) {
          poVar2 = obj_00;
        }
      }
      goto LAB_002771cd;
    }
  }
  return;
LAB_0027744a:
  if (poVar13 == obj || poVar13 == (obj *)0x0) {
    return;
  }
  if ((flag == 0x40) || (bVar10 = 0, flag == 1)) {
    bVar10 = (byte)mon->misc_worn_check & 2;
  }
  if (obj != (obj *)0x0) {
    bVar10 = bVar10 + objects[obj->otyp].oc_delay;
    obj->owornmask = 0;
  }
  if (creation == '\0') {
    if (mon->wormno == '\0') {
      if ((viz_array[mon->my][mon->mx] & 2U) != 0) goto LAB_00277583;
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00277515;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0027750c;
      }
      else {
LAB_0027750c:
        if (ublindf == (obj *)0x0) goto LAB_00277659;
LAB_00277515:
        if (ublindf->oartifact != '\x1d') goto LAB_00277659;
      }
      if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
           (((youmonst.data)->mflags3 & 0x100) != 0)) && ((viz_array[mon->my][mon->mx] & 1U) != 0))
         && ((mon->data->mflags3 & 0x200) != 0)) goto LAB_00277583;
    }
    else {
      bVar3 = worm_known(lev,mon);
      if (bVar3 != '\0') {
LAB_00277583:
        uVar14 = *(uint *)&mon->field_0x60;
        if ((((uVar14 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
           (u.uprops[0xc].extrinsic != 0)) {
          if ((uVar14 & 0x280) == 0) goto LAB_002775d9;
        }
        else if (((uVar14 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_002775d9:
          if ((u._1052_4_ & 0x20) == 0) {
            if (obj == (obj *)0x0) {
              buf[0] = '\0';
            }
            else {
              pcVar8 = distant_name(obj,doname);
              sprintf(buf," removes %s and",pcVar8);
            }
            pcVar8 = Monnam(mon);
            pcVar9 = distant_name(poVar13,doname);
            pline("%s%s puts on %s.",pcVar8,buf,pcVar9);
          }
        }
      }
    }
LAB_00277659:
    uVar11 = bVar10 + objects[poVar13->otyp].oc_delay;
    mon->mfrozen = uVar11;
    if (uVar11 != '\0') {
      mon->field_0x62 = mon->field_0x62 & 0xfb;
    }
  }
  if (obj != (obj *)0x0) {
    update_mon_intrinsics(lev,mon,obj,'\0',creation);
  }
  mon->misc_worn_check = mon->misc_worn_check | (uint)flag;
  poVar13->owornmask = poVar13->owornmask | (uint)flag;
  uVar14 = 1;
  update_mon_intrinsics(lev,mon,poVar13,'\x01',creation);
  if (creation != '\0') {
    return;
  }
  if (mon->wormno == '\0') {
    if ((viz_array[mon->my][mon->mx] & 2U) == 0) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00277728;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0027771f;
      }
      else {
LAB_0027771f:
        if (ublindf == (obj *)0x0) goto LAB_002777f0;
LAB_00277728:
        if (ublindf->oartifact != '\x1d') goto LAB_002777f0;
      }
      if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
           (((youmonst.data)->mflags3 & 0x100) == 0)) || ((viz_array[mon->my][mon->mx] & 1U) == 0))
         || ((mon->data->mflags3 & 0x200) == 0)) goto LAB_002777f0;
    }
  }
  else {
    bVar3 = worm_known(lev,mon);
    if (bVar3 == '\0') goto LAB_002777f0;
  }
  uVar1 = *(uint *)&mon->field_0x60;
  if ((((uVar1 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
    if ((char)uVar1 < '\0') goto LAB_002777f0;
  }
  else if (((char)uVar1 < '\0') || (((youmonst.data)->mflags1 & 0x1000000) == 0)) goto LAB_002777f0;
  uVar14 = 1;
  if ((uVar1 >> 9 & 1) == 0) {
    uVar14 = (uint)u._1052_4_ >> 5 & 1;
  }
LAB_002777f0:
  if (uVar12 == uVar14) {
    return;
  }
  if ((mon->field_0x60 & 2) == 0) {
    return;
  }
  if (u.uprops[0xc].intrinsic != 0) {
    return;
  }
  if (u.uprops[0xc].extrinsic != 0) {
    return;
  }
  if (((youmonst.data)->mflags1 & 0x1000000) != 0) {
    return;
  }
  pline("Suddenly you cannot see %s.",nambuf);
  discover_object((int)poVar13->otyp,'\x01','\x01');
  return;
}

Assistant:

static void m_dowear_type(struct level *lev, struct monst *mon, long flag,
			  boolean creation, boolean racialexception)
{
	struct obj *old, *best, *obj;
	int m_delay = 0;
	int unseen = !canseemon(lev, mon);
	char nambuf[BUFSZ];

	if (mon->mfrozen) return; /* probably putting previous item on */

	/* Get a copy of monster's name before altering its visibility */
	strcpy(nambuf, See_invisible ? Monnam(mon) : mon_nam(mon));

	old = which_armor(mon, flag);
	if (old && old->cursed) return;
	if (old && flag == W_AMUL) return; /* no such thing as better amulets */
	best = old;

	for (obj = mon->minvent; obj; obj = obj->nobj) {
	    switch(flag) {
		case W_AMUL:
		    if (obj->oclass != AMULET_CLASS ||
			    (obj->otyp != AMULET_OF_LIFE_SAVING &&
				obj->otyp != AMULET_OF_REFLECTION &&
				!(obj->oprops & ITEM_REFLECTION)))
			continue;
		    best = obj;
		    goto outer_break; /* no such thing as better amulets */
		case W_ARMU:
		    if (!is_shirt(obj)) continue;
		    break;
		case W_ARMC:
		    if (!is_cloak(obj)) continue;
		    break;
		case W_ARMH:
		    if (!is_helmet(obj)) continue;
		    /* (flimsy exception matches polyself handling) */
		    if (has_horns(mon->data) && !is_flimsy(obj)) continue;
		    break;
		case W_ARMS:
		    if (!is_shield(obj)) continue;
		    break;
		case W_ARMG:
		    if (!is_gloves(obj)) continue;
		    break;
		case W_ARMF:
		    if (!is_boots(obj)) continue;
		    break;
		case W_ARM:
		    if (!is_suit(obj)) continue;
		    if (racialexception && (racial_exception(mon, obj) < 1)) continue;
		    break;
	    }
	    if (obj->owornmask) continue;
	    /* I'd like to define a VISIBLE_ARM_BONUS which doesn't assume the
	     * monster knows obj->spe, but if I did that, a monster would keep
	     * switching forever between two -2 caps since when it took off one
	     * it would forget spe and once again think the object is better
	     * than what it already has.
	     */
	    if (best && (arm_bonus(best, mon) + extra_pref(mon, best) >=
			 arm_bonus(obj, mon) + extra_pref(mon, obj)))
		continue;
	    best = obj;
	}
outer_break:
	if (!best || best == old) return;

	/* if wearing a cloak, account for the time spent removing
	   and re-wearing it when putting on a suit or shirt */
	if ((flag == W_ARM || flag == W_ARMU) && (mon->misc_worn_check & W_ARMC))
	    m_delay += 2;
	/* when upgrading a piece of armor, account for time spent
	   taking off current one */
	if (old)
	    m_delay += objects[old->otyp].oc_delay;

	if (old) /* do this first to avoid "(being worn)" */
	    old->owornmask = 0L;
	if (!creation) {
	    if (canseemon(lev, mon)) {
		char buf[BUFSZ];

		if (old)
		    sprintf(buf, " removes %s and", distant_name(old, doname));
		else
		    buf[0] = '\0';
		pline("%s%s puts on %s.", Monnam(mon),
		      buf, distant_name(best,doname));
	    } /* can see it */
	    m_delay += objects[best->otyp].oc_delay;
	    mon->mfrozen = m_delay;
	    if (mon->mfrozen) mon->mcanmove = 0;
	}
	if (old)
	    update_mon_intrinsics(lev, mon, old, FALSE, creation);
	mon->misc_worn_check |= flag;
	best->owornmask |= flag;
	update_mon_intrinsics(lev, mon, best, TRUE, creation);
	/* if couldn't see it but now can, or vice versa, */
	if (!creation && (unseen ^ !canseemon(lev, mon))) {
		if (mon->minvis && !See_invisible) {
			pline("Suddenly you cannot see %s.", nambuf);
			makeknown(best->otyp);
		} /* else if (!mon->minvis) pline("%s suddenly appears!", Amonnam(mon)); */
	}
}